

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjTypeSpecFldInfo.cpp
# Opt level: O2

JITTypeHolder __thiscall ObjTypeSpecFldInfo::GetType(ObjTypeSpecFldInfo *this,uint i)

{
  code *pcVar1;
  bool bVar2;
  Type in_RAX;
  undefined4 *puVar3;
  JITType *pJVar4;
  JITTypeHolderBase<void> local_28;
  
  local_28.t = in_RAX;
  if ((i != 0) && (((this->m_data).flags & 2) == 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                       ,0x11f,"(i == 0 || IsPoly())","i == 0 || IsPoly()");
    if (!bVar2) goto LAB_005a0d61;
    *puVar3 = 0;
  }
  if ((this->m_data).fixedFieldInfoArraySize <= i) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                       ,0x120,"(i < m_data.fixedFieldInfoArraySize)",
                       "i < m_data.fixedFieldInfoArraySize");
    if (!bVar2) {
LAB_005a0d61:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pJVar4 = FixedFieldInfo::GetType((FixedFieldInfo *)((this->m_data).fixedFieldInfoArray.ptr + i));
  if (pJVar4 == (JITType *)0x0) {
    pJVar4 = (JITType *)0x0;
  }
  else {
    pJVar4 = FixedFieldInfo::GetType((FixedFieldInfo *)((this->m_data).fixedFieldInfoArray.ptr + i))
    ;
  }
  JITTypeHolderBase<void>::JITTypeHolderBase(&local_28,pJVar4);
  return (JITTypeHolder)local_28.t;
}

Assistant:

JITTypeHolder
ObjTypeSpecFldInfo::GetType(uint i) const
{
    Assert(i == 0 || IsPoly());
    AssertOrFailFast(i < m_data.fixedFieldInfoArraySize);
    JITType * type = GetFixedFieldInfoArray()[i].GetType();
    if (!type)
    {
        return nullptr;
    }
    return JITTypeHolder(GetFixedFieldInfoArray()[i].GetType());
}